

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O3

void __thiscall xray_re::xr_ogf_v4::load_header(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t *puVar1;
  byte *pbVar2;
  ushort *puVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  
  pbVar2 = (r->field_2).m_p;
  (r->field_2).m_p = pbVar2 + 1;
  (this->super_xr_ogf).m_version = (uint)*pbVar2;
  pbVar2 = (r->field_2).m_p;
  (r->field_2).m_p = pbVar2 + 1;
  (this->super_xr_ogf).m_model_type = (uint)*pbVar2;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  this->m_shader_id = (uint)*puVar3;
  puVar4 = (r->field_2).m_p;
  *(undefined8 *)((long)&(this->super_xr_ogf).m_bbox.field_0 + 0x10) =
       *(undefined8 *)(puVar4 + 0x10);
  uVar5 = *(undefined8 *)(puVar4 + 8);
  *(undefined8 *)&(this->super_xr_ogf).m_bbox.field_0 = *(undefined8 *)puVar4;
  *(undefined8 *)((long)&(this->super_xr_ogf).m_bbox.field_0 + 8) = uVar5;
  puVar4 = (r->field_2).m_p;
  (r->field_2).m_p = puVar4 + 0x18;
  uVar5 = *(undefined8 *)(puVar4 + 0x20);
  *(undefined8 *)&(this->super_xr_ogf).m_bsphere.p.field_0 = *(undefined8 *)(puVar4 + 0x18);
  *(undefined8 *)((long)&(this->super_xr_ogf).m_bsphere.p.field_0 + 8) = uVar5;
  (r->field_2).m_p = (r->field_2).m_p + 0x10;
  puVar1 = &(this->super_xr_ogf).m_loaded;
  *(byte *)puVar1 = (byte)*puVar1 | 2;
  return;
}

Assistant:

inline uint8_t xr_reader::r_u8() { return *m_p++; }